

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

PackedSlice * __thiscall kratos::PackedSlice::slice_member(PackedSlice *this,string *member_name)

{
  int iVar1;
  undefined4 extraout_var;
  PackedSlice *struct_;
  shared_ptr<kratos::PortPackedStruct> sVar2;
  shared_ptr<kratos::VarPackedStruct> sVar3;
  PackedSlice *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined1 local_38 [8];
  shared_ptr<kratos::PackedSlice> p;
  
  struct_ = (PackedSlice *)this->original_struct_;
  if ((PackedSlice *)this->original_struct_ == (PackedSlice *)0x0) {
    iVar1 = (*(this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode[0x17])(this);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode[0x29])(this);
      if (*(int *)(CONCAT44(extraout_var,iVar1) + 0x168) == 4) {
        sVar2 = Var::as<kratos::PortPackedStruct>((Var *)local_38);
        (*(((VarSlice *)local_38)->super_Var).super_IRNode._vptr_IRNode[0x2e])
                  (&local_48,local_38,
                   sVar2.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
      }
      else {
        sVar3 = Var::as<kratos::VarPackedStruct>((Var *)local_38);
        (*(((VarSlice *)local_38)->super_Var).super_IRNode._vptr_IRNode[0x2d])
                  (&local_48,local_38,
                   sVar3.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
      struct_ = local_48;
    }
    else {
      struct_ = (PackedSlice *)this->def_->struct_;
    }
  }
  local_48 = this;
  std::make_shared<kratos::PackedSlice,kratos::PackedSlice*>((PackedSlice **)local_38);
  set_up((PackedSlice *)local_38,(PackedStruct *)struct_,member_name);
  std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
  emplace_back<std::shared_ptr<kratos::PackedSlice>&>
            ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
              *)&(this->super_VarSlice).super_Var.slices_,
             (shared_ptr<kratos::PackedSlice> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
  return (PackedSlice *)local_38;
}

Assistant:

PackedSlice &PackedSlice::slice_member(const std::string &member_name) {
    const PackedStruct *struct_;
    if (original_struct_) {
        struct_ = original_struct_;
    } else if (is_struct()) {
        struct_ = def_->struct_;
    } else {
        auto *root = get_var_root_parent();
        if (root->type() == VarType::PortIO) {
            auto v = root->as<PortPackedStruct>();
            struct_ = v->packed_struct().get();
        } else {
            auto v = root->as<VarPackedStruct>();
            struct_ = v->packed_struct().get();
        }
    }
    std::shared_ptr<PackedSlice> p = ::make_shared<PackedSlice>(this);
    p->set_up(*struct_, member_name);
    slices_.emplace_back(p);
    return *p;
}